

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void __thiscall vkt::ssbo::BufferBlock::BufferBlock(BufferBlock *this,char *blockName)

{
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,blockName,&local_29);
  (this->m_instanceName)._M_dataplus._M_p = (pointer)&(this->m_instanceName).field_2;
  (this->m_instanceName)._M_string_length = 0;
  (this->m_instanceName).field_2._M_local_buf[0] = '\0';
  (this->m_variables).
  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_variables).
  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_variables).
  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_arraySize = -1;
  (this->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  setArraySize(this,0);
  return;
}

Assistant:

BufferBlock::BufferBlock (const char* blockName)
	: m_blockName	(blockName)
	, m_arraySize	(-1)
	, m_flags		(0)
{
	setArraySize(0);
}